

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O0

void __thiscall
notch::core::ConvolutionLayer2D<3UL>::ConvolutionLayer2D
          (ConvolutionLayer2D<3UL> *this,size_t imageWidth,size_t imageHeight,Array *weights,
          Array *bias)

{
  valarray<float> *pvVar1;
  size_t sVar2;
  element_type *peVar3;
  size_t sVar4;
  float local_4c;
  float local_48;
  float local_44;
  float local_40 [4];
  Array *local_30;
  Array *bias_local;
  Array *weights_local;
  size_t imageHeight_local;
  size_t imageWidth_local;
  ConvolutionLayer2D<3UL> *this_local;
  
  local_30 = bias;
  bias_local = weights;
  weights_local = (Array *)imageHeight;
  imageHeight_local = imageWidth;
  imageWidth_local = (size_t)this;
  ABackpropLayer::ABackpropLayer(&this->super_ABackpropLayer);
  (this->super_ABackpropLayer)._vptr_ABackpropLayer = (_func_int **)&PTR_tag_abi_cxx11__002ba658;
  this->inputWidth = imageHeight_local;
  this->inputHeight = (size_t)weights_local;
  this->inputSize = this->inputWidth * this->inputHeight;
  this->outputWidth = imageHeight_local - 2;
  this->outputHeight = (size_t)((long)&weights_local[-1]._M_data + 6);
  this->outputSize = this->outputWidth * this->outputHeight;
  pvVar1 = (valarray<float> *)operator_new(0x10);
  std::valarray<float>::valarray(pvVar1,bias_local);
  ::std::shared_ptr<std::valarray<float>>::shared_ptr<std::valarray<float>,void>
            ((shared_ptr<std::valarray<float>> *)&this->weights,pvVar1);
  pvVar1 = (valarray<float> *)operator_new(0x10);
  std::valarray<float>::valarray(pvVar1,local_30);
  ::std::shared_ptr<std::valarray<float>>::shared_ptr<std::valarray<float>,void>
            ((shared_ptr<std::valarray<float>> *)&this->bias,pvVar1);
  local_40[0] = 0.0;
  std::valarray<float>::valarray(&this->localGrad,local_40,this->outputSize);
  pvVar1 = (valarray<float> *)operator_new(0x10);
  local_44 = 0.0;
  std::valarray<float>::valarray(pvVar1,&local_44,9);
  ::std::shared_ptr<std::valarray<float>>::shared_ptr<std::valarray<float>,void>
            ((shared_ptr<std::valarray<float>> *)&this->weightSensitivity,pvVar1);
  pvVar1 = (valarray<float> *)operator_new(0x10);
  local_48 = 0.0;
  std::valarray<float>::valarray(pvVar1,&local_48,1);
  ::std::shared_ptr<std::valarray<float>>::shared_ptr<std::valarray<float>,void>
            ((shared_ptr<std::valarray<float>> *)&this->biasSensitivity,pvVar1);
  local_4c = 0.0;
  std::valarray<float>::valarray(&this->propagatedErrors,&local_4c,this->inputSize);
  std::shared_ptr<notch::core::ALearningPolicy>::shared_ptr(&this->policy);
  sVar2 = std::valarray<float>::size(bias_local);
  peVar3 = std::__shared_ptr_access<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->weightSensitivity);
  sVar4 = std::valarray<float>::size(peVar3);
  if (sVar2 != sVar4) {
    __assert_fail("weights.size() == weightSensitivity->size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/astanin[P]notch/notch.hpp"
                  ,0x6cb,
                  "notch::ConvolutionLayer2D<>::ConvolutionLayer2D(size_t, size_t, const Array &, const Array &) [kernelSize = 3]"
                 );
  }
  sVar2 = std::valarray<float>::size(local_30);
  peVar3 = std::__shared_ptr_access<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->biasSensitivity);
  sVar4 = std::valarray<float>::size(peVar3);
  if (sVar2 == sVar4) {
    return;
  }
  __assert_fail("bias.size() == biasSensitivity->size()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/astanin[P]notch/notch.hpp"
                ,0x6cc,
                "notch::ConvolutionLayer2D<>::ConvolutionLayer2D(size_t, size_t, const Array &, const Array &) [kernelSize = 3]"
               );
}

Assistant:

ConvolutionLayer2D(size_t imageWidth, size_t imageHeight,
                       const Array &weights, const Array &bias)
        : inputWidth(imageWidth), inputHeight(imageHeight),
          inputSize(inputWidth * inputHeight),
          outputWidth(imageWidth - kernelSize + 1),
          outputHeight(imageHeight - kernelSize + 1),
          outputSize(outputWidth * outputHeight),
          weights(new Array(weights)),
          bias(new Array(bias)),
          localGrad(0.0, outputSize),
          weightSensitivity(new Array(0.0, kernelSize*kernelSize)),
          biasSensitivity(new Array(0.0, 1)),
          propagatedErrors(0.0, inputSize) {
              assert(weights.size() == weightSensitivity->size());
              assert(bias.size() == biasSensitivity->size());
          }